

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

bool __thiscall
libaom_examples::anon_unknown_0::ParsedValue::ValueAsFloatingPoint
          (ParsedValue *this,int line_idx,double *v)

{
  Type TVar1;
  double dVar2;
  
  TVar1 = this->type_;
  if (TVar1 == kNone) {
    fprintf(_stderr,"No value found where floating point value was expected at line %d\n",line_idx);
  }
  else {
    if (TVar1 == kFloatingPoint) {
      dVar2 = this->double_value_;
    }
    else {
      dVar2 = (double)this->int_value_;
    }
    *v = dVar2;
  }
  return TVar1 != kNone;
}

Assistant:

bool ValueAsFloatingPoint(int line_idx, double *v) {
    if (type_ == Type::kNone) {
      fprintf(
          stderr,
          "No value found where floating point value was expected at line %d\n",
          line_idx);
      return false;
    }
    *v = (type_ == Type::kFloatingPoint) ? double_value_
                                         : static_cast<double>(int_value_);
    return true;
  }